

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.hpp
# Opt level: O2

bool __thiscall httplib::detail::SocketStream::is_readable(SocketStream *this)

{
  ssize_t sVar1;
  
  sVar1 = select_read(this->sock_,this->read_timeout_sec_,this->read_timeout_usec_);
  return 0 < sVar1;
}

Assistant:

inline bool SocketStream::is_readable() const {
            return select_read(sock_, read_timeout_sec_, read_timeout_usec_) > 0;
        }